

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::checkTernaryPriority(CheckerVisitor *this,TerExpr *expr)

{
  TreeOp op;
  Node *n;
  Expr *e;
  bool bVar1;
  char *pcVar2;
  CheckerVisitor *this_00;
  
  if (this->effectsOnly == false) {
    n = &expr->_a->super_Node;
    op = n->_op;
    if (((ulong)op < 0x2b) && ((0x7f812880000U >> ((ulong)op & 0x3f) & 1) != 0)) {
      if (op != TO_AND) {
LAB_0014ff15:
        pcVar2 = treeopStr(op);
        report(this,n,0x46,pcVar2);
        return;
      }
      e = *(Expr **)&n[1]._coordinates;
      this_00 = this;
      bVar1 = isUpperCaseIdentifier(this,(Expr *)n[1].super_ArenaObj._vptr_ArenaObj);
      if (!bVar1) {
        bVar1 = isUpperCaseIdentifier(this_00,e);
        if ((!bVar1) &&
           (((e->super_Node)._op != TO_LITERAL || (*(int *)&(e->super_Node).field_0x1c != 1))))
        goto LAB_0014ff15;
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkTernaryPriority(const TerExpr *expr) {
  if (effectsOnly)
    return;

  const Expr *cond = expr->a();

  if (isSuspiciousTernaryConditionOp(cond->op())) {
    const BinExpr *binCond = static_cast<const BinExpr *>(cond);
    const Expr *l = binCond->lhs();
    const Expr *r = binCond->rhs();
    bool isIgnore = cond->op() == TO_AND
      && (isUpperCaseIdentifier(l) || isUpperCaseIdentifier(r)
        || (r->op() == TO_LITERAL && r->asLiteral()->kind() == LK_INT));

    if (!isIgnore) {
      report(cond, DiagnosticsId::DI_TERNARY_PRIOR, treeopStr(cond->op()));
    }
  }
}